

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

string * __thiscall
(anonymous_namespace)::NameTreeDetails::itemsKey_abi_cxx11_(NameTreeDetails *this)

{
  int iVar1;
  allocator<char> local_9;
  
  if (itemsKey[abi:cxx11]()::k_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&itemsKey[abi:cxx11]()::k_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&itemsKey[abi:cxx11]()::k_abi_cxx11_,"/Names",&local_9);
      __cxa_atexit(std::__cxx11::string::~string,&itemsKey[abi:cxx11]()::k_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&itemsKey[abi:cxx11]()::k_abi_cxx11_);
    }
  }
  return &itemsKey[abi:cxx11]()::k_abi_cxx11_;
}

Assistant:

std::string const&
        itemsKey() const override
        {
            static std::string k("/Names");
            return k;
        }